

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall CMU462::Application::updateWidgets(Application *this)

{
  int iVar1;
  Scene *this_00;
  XFormWidget *pXVar2;
  XFormWidget *this_01;
  
  this_00 = this->scene;
  pXVar2 = (XFormWidget *)(this_00->selected).object;
  if (pXVar2 != (XFormWidget *)0x0) {
    iVar1 = *(int *)&(this->super_Renderer).field_0xc;
    if (iVar1 == 2) {
      if (this->action != Wave) {
        if (this->action != Object) {
          return;
        }
        if (pXVar2 == this_00->elementTransform) {
          return;
        }
        DynamicScene::XFormWidget::setTarget(this_00->elementTransform,&this_00->selected);
        return;
      }
      this_01 = this_00->elementTransform;
    }
    else {
      if (iVar1 != 0) goto LAB_00194c87;
      this_01 = this_00->elementTransform;
      if (this->action != Edit) {
        DynamicScene::Scene::removeObject(this_00,&this_01->super_SceneObject);
        return;
      }
    }
    if ((pXVar2 != this_01) && ((this_00->selected).element != (HalfedgeElement *)0x0)) {
      DynamicScene::XFormWidget::setTarget(this_01,&this_00->selected);
      return;
    }
    return;
  }
LAB_00194c87:
  DynamicScene::Scene::removeObject(this_00,&this_00->elementTransform->super_SceneObject);
  return;
}

Assistant:

void Application::updateWidgets() {
  if (scene->selected.object == nullptr) {
    scene->removeObject(scene->elementTransform);
    return;
  }

  if (mode == MODEL_MODE) {
    if (action == Action::Edit) {
      if (scene->selected.object != scene->elementTransform &&
          scene->selected.element != nullptr) {
        scene->elementTransform->setTarget(scene->selected);
      }
    } else {
      scene->removeObject(scene->elementTransform);
      return;
    }
  } else if (mode == ANIMATE_MODE) {
    if (action == Action::Object) {
      if (scene->selected.object != scene->elementTransform) {
        scene->elementTransform->setTarget(scene->selected);
      }
    } else if (action == Action::Wave) {
      if (scene->selected.object != scene->elementTransform &&
          scene->selected.element != nullptr) {
        scene->elementTransform->setTarget(scene->selected);
      }
    }
  } else {
    scene->removeObject(scene->elementTransform);
    return;
  }
}